

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O2

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PushLowpass<true>,_true>::set_high_frequency_cutoff
          (LowpassBase<Outputs::Speaker::PushLowpass<true>,_true> *this,float high_frequency)

{
  float fVar1;
  
  std::mutex::lock(&this->filter_parameters_mutex_);
  fVar1 = (this->filter_parameters_).high_frequency_cutoff;
  if ((fVar1 != high_frequency) || (NAN(fVar1) || NAN(high_frequency))) {
    (this->filter_parameters_).high_frequency_cutoff = high_frequency;
    (this->filter_parameters_).parameters_are_dirty = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  return;
}

Assistant:

void set_high_frequency_cutoff(float high_frequency) {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.high_frequency_cutoff == high_frequency) {
				return;
			}
			filter_parameters_.high_frequency_cutoff = high_frequency;
			filter_parameters_.parameters_are_dirty = true;
		}